

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_highbd_dist_wtd_convolve_x_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  CONV_BUF_TYPE *pCVar4;
  int16_t *piVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  char cVar9;
  byte bVar10;
  uint16_t uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  uint16_t *puVar17;
  ulong uVar18;
  int iVar19;
  bool bVar20;
  int local_90;
  ulong local_88;
  
  bVar8 = (byte)conv_params->round_0;
  cVar9 = (char)conv_params->round_1;
  cVar7 = bVar8 + cVar9;
  cVar6 = (char)bd - cVar7;
  if (0 < h) {
    pCVar4 = conv_params->dst;
    uVar1 = filter_params_x->taps;
    iVar13 = (1 << (cVar6 + 0xdU & 0x1f)) + (1 << (cVar6 + 0xeU & 0x1f));
    bVar10 = 0xe - cVar7;
    piVar5 = filter_params_x->filter_ptr;
    iVar2 = conv_params->dst_stride;
    local_90 = 1 - (uint)(uVar1 >> 1);
    local_88 = 0;
    do {
      if (0 < w) {
        iVar3 = conv_params->do_average;
        uVar18 = 0;
        iVar19 = local_90;
        do {
          if ((ulong)filter_params_x->taps == 0) {
            iVar14 = 0;
          }
          else {
            uVar16 = 0;
            iVar14 = 0;
            do {
              iVar14 = iVar14 + (uint)src[(long)iVar19 + uVar16] *
                                (int)*(short *)((long)piVar5 +
                                               uVar16 * 2 +
                                               (ulong)((subpel_x_qn & 0xfU) * (uint)uVar1 * 2));
              uVar16 = uVar16 + 1;
            } while (filter_params_x->taps != uVar16);
          }
          iVar14 = ((iVar14 + ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f)) << (7U - cVar9 & 0x1f)
                   ) + iVar13;
          if (iVar3 == 0) {
            uVar11 = (uint16_t)iVar14;
            puVar17 = pCVar4 + local_88 * (long)iVar2;
          }
          else {
            uVar15 = (uint)(pCVar4 + local_88 * (long)iVar2)[uVar18];
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              iVar14 = (int)(iVar14 + uVar15) >> 1;
            }
            else {
              iVar14 = (int)(iVar14 * conv_params->bck_offset + uVar15 * conv_params->fwd_offset) >>
                       4;
            }
            uVar15 = iVar14 + (((1 << (bVar10 & 0x1f)) >> 1) - iVar13) >> (bVar10 & 0x1f);
            if (bd == 10) {
              bVar20 = uVar15 < 0x3ff;
              uVar12 = 0x3ff;
            }
            else if (bd == 0xc) {
              bVar20 = uVar15 < 0xfff;
              uVar12 = 0xfff;
            }
            else {
              bVar20 = uVar15 < 0xff;
              uVar12 = 0xff;
            }
            if (bVar20) {
              uVar12 = uVar15;
            }
            uVar11 = (uint16_t)uVar12;
            puVar17 = dst + local_88 * (long)dst_stride;
            if ((int)uVar15 < 0) {
              uVar11 = 0;
            }
          }
          puVar17[uVar18] = uVar11;
          uVar18 = uVar18 + 1;
          iVar19 = iVar19 + 1;
        } while (uVar18 != (uint)w);
      }
      local_88 = local_88 + 1;
      local_90 = local_90 + src_stride;
    } while (local_88 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_x_c(const uint16_t *src, int src_stride,
                                      uint16_t *dst, int dst_stride, int w,
                                      int h,
                                      const InterpFilterParams *filter_params_x,
                                      const int subpel_x_qn,
                                      ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  assert(round_bits >= 0);
  assert(bits >= 0);
  // horizontal filter
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_x->taps; ++k) {
        res += x_filter[k] * src[y * src_stride + x - fo_horiz + k];
      }
      res = (1 << bits) * ROUND_POWER_OF_TWO(res, conv_params->round_0);
      res += round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, round_bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}